

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

uint * eastl::upper_bound<unsigned_int_const*,unsigned_int>(uint *first,uint *last,uint *value)

{
  uint *n;
  DifferenceType len2;
  uint *i;
  DifferenceType len;
  uint *value_local;
  uint *last_local;
  uint *first_local;
  
  len = (DifferenceType)value;
  value_local = last;
  last_local = first;
  n = (uint *)distance<unsigned_int_const*>(first,last);
  while (i = n, 0 < (long)i) {
    len2 = (DifferenceType)last_local;
    n = (uint *)((long)i >> 1);
    advance<unsigned_int_const*,long>((uint **)&len2,(long)n);
    if (*(uint *)len2 <= *(uint *)len) {
      last_local = (uint *)(len2 + 4);
      n = (uint *)((long)i - ((long)n + 1));
    }
  }
  return last_local;
}

Assistant:

ForwardIterator
    upper_bound(ForwardIterator first, ForwardIterator last, const T& value)
    {
        typedef typename eastl::iterator_traits<ForwardIterator>::difference_type DifferenceType;

        DifferenceType len = eastl::distance(first, last);

        while(len > 0)
        {
            ForwardIterator i    = first;
            DifferenceType  len2 = len >> 1; // We use '>>1' here instead of '/2' because MSVC++ for some reason generates significantly worse code for '/2'. Go figure.

            eastl::advance(i, len2);

            if(!(value < *i)) // Note that we always express value comparisons in terms of < or ==.
            {
                first = ++i;
                len -= len2 + 1;
            }
            else
            {
                // Disabled because std::upper_bound doesn't specify (23.3.3.2, p3) this can be done: EASTL_VALIDATE_COMPARE(!(*i < value)); // Validate that the compare function is sane.
                len = len2;
            }
        }
        return first;
    }